

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall
CS248::DynamicScene::Skeleton::setSelection(Skeleton *this,int pickID,Selection *selection)

{
  bool bVar1;
  iterator this_00;
  mapped_type *ppJVar2;
  undefined8 *in_RDX;
  key_type_conflict *in_stack_00000008;
  map<int,_CS248::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Joint_*>_>_>
  *in_stack_00000010;
  map<int,_CS248::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Joint_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  
  this_00 = std::
            map<int,_CS248::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Joint_*>_>_>
            ::find(in_stack_ffffffffffffffc8,(key_type_conflict *)0x21296d);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_CS248::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Joint_*>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_28);
  if (bVar1) {
    Selection::clear((Selection *)this_00._M_node);
    ppJVar2 = std::
              map<int,_CS248::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Joint_*>_>_>
              ::operator[](in_stack_00000010,in_stack_00000008);
    *in_RDX = *ppJVar2;
  }
  return;
}

Assistant:

void Skeleton::setSelection(int pickID, Selection& selection) {
  // Set the selection to the joint specified by the given picking ID;
  // these values were generated in Skeleton::draw_pick.
  if (idToJoint.find(pickID) != idToJoint.end()) {
    selection.clear();
    selection.object = idToJoint[pickID];
  }
}